

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

int archive_compressor_compress_close(archive_write_filter *f)

{
  void *__ptr;
  int iVar1;
  int local_1c;
  int ret2;
  int ret;
  private_data_conflict5 *state;
  archive_write_filter *f_local;
  
  __ptr = f->data;
  local_1c = output_code(f,*(int *)((long)__ptr + 0x65164));
  if ((local_1c == 0) && (local_1c = output_flush(f), local_1c == 0)) {
    local_1c = __archive_write_filter
                         (f->next_filter,*(void **)((long)__ptr + 0x65178),
                          *(size_t *)((long)__ptr + 0x65188));
  }
  iVar1 = __archive_write_close_filter(f->next_filter);
  if (iVar1 < local_1c) {
    local_1c = iVar1;
  }
  free(*(void **)((long)__ptr + 0x65178));
  free(__ptr);
  return local_1c;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret, ret2;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		goto cleanup;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		goto cleanup;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
cleanup:
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	free(state->compressed);
	free(state);
	return (ret);
}